

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_0::getTestedSize
          (anon_unknown_0 *this,deUint32 target,deUint32 format,IVec3 *targetSize)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  Vector<int,_3> VVar7;
  IVec3 IVar8;
  IVec3 texelBlockPixelSize;
  tcu local_40 [12];
  tcu local_34 [12];
  
  getTexelBlockPixelSize((anon_unknown_0 *)&texelBlockPixelSize,format);
  if ((target == 0x806f) || (target == 0x8c1a)) {
    tcu::operator/(local_40,targetSize,&texelBlockPixelSize);
    tcu::operator+(local_34,1,(Vector<int,_3> *)local_40);
    VVar7 = tcu::operator*((tcu *)this,(Vector<int,_3> *)local_34,&texelBlockPixelSize);
    iVar3 = VVar7.m_data[2];
  }
  else {
    if (target == 0x8513) {
      uVar1 = texelBlockPixelSize.m_data[1];
      if (texelBlockPixelSize.m_data[1] < texelBlockPixelSize.m_data[0]) {
        uVar1 = texelBlockPixelSize.m_data[0];
      }
      uVar4 = (ulong)uVar1;
      if (texelBlockPixelSize.m_data[0] < texelBlockPixelSize.m_data[1]) {
        texelBlockPixelSize.m_data[1] = texelBlockPixelSize.m_data[0];
      }
      uVar2 = (ulong)(uint)texelBlockPixelSize.m_data[1];
      iVar6 = 1;
      uVar5 = (long)texelBlockPixelSize.m_data[1] / 2 & 0xffffffff;
      while (iVar3 = (int)uVar5, 1 < iVar3) {
        while ((int)uVar4 % iVar3 == 0) {
          if ((int)uVar2 % iVar3 != 0) break;
          iVar6 = iVar6 * iVar3;
          uVar2 = (long)(int)uVar2 / (long)iVar3 & 0xffffffff;
          uVar4 = (long)(int)uVar4 / (long)iVar3 & 0xffffffff;
        }
        uVar5 = (ulong)(iVar3 - 1);
      }
      iVar6 = (int)uVar2 * (int)uVar4 * iVar6;
      iVar3 = targetSize->m_data[0] % iVar6;
      iVar6 = (targetSize->m_data[0] / iVar6 + 1) * iVar6;
      *(int *)this = iVar6;
    }
    else {
      iVar3 = targetSize->m_data[1] % texelBlockPixelSize.m_data[1];
      iVar6 = (targetSize->m_data[1] / texelBlockPixelSize.m_data[1] + -1) *
              texelBlockPixelSize.m_data[1];
      *(int *)this = (targetSize->m_data[0] / texelBlockPixelSize.m_data[0] + 1) *
                     texelBlockPixelSize.m_data[0];
    }
    *(int *)(this + 4) = iVar6;
    *(undefined4 *)(this + 8) = 1;
  }
  IVar8.m_data[2] = iVar3;
  IVar8.m_data._0_8_ = this;
  return (IVec3)IVar8.m_data;
}

Assistant:

IVec3 getTestedSize (deUint32 target, deUint32 format, const IVec3& targetSize)
{
	const IVec3 texelBlockPixelSize = getTexelBlockPixelSize(format);
	const bool	isCube				= target == GL_TEXTURE_CUBE_MAP;
	const bool	is3D				= target == GL_TEXTURE_3D || target == GL_TEXTURE_2D_ARRAY;

	if (isCube)
	{
		const int	multiplier	= smallestCommonMultiple(texelBlockPixelSize.x(), texelBlockPixelSize.y());
		const int	size		= (1 + (targetSize.x() / multiplier)) * multiplier;

		return IVec3(size, size, 1);
	}
	else if (is3D)
	{
		return (1 + (targetSize / texelBlockPixelSize)) * texelBlockPixelSize;
	}
	else
	{
		const int width = (1 + targetSize.x() / texelBlockPixelSize.x()) * texelBlockPixelSize.x();
		const int height = ((targetSize.y() / texelBlockPixelSize.y()) - 1) * texelBlockPixelSize.y();

		return IVec3(width, height, 1);
	}
}